

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImathColorAlgo.h
# Opt level: O0

PackedColor Imath_3_2::rgb2packed<float>(Color4<float> *c)

{
  Color4<float> *c_local;
  
  return (uint)(long)(c->r * 255.0) | (int)(long)(c->g * 255.0) << 8 |
         (int)(long)(c->b * 255.0) << 0x10 | (int)(long)(c->a * 255.0) << 0x18;
}

Assistant:

IMATH_HOSTDEVICE IMATH_CONSTEXPR14 PackedColor
rgb2packed (const Color4<T>& c) IMATH_NOEXCEPT
{
    if (std::numeric_limits<T>::is_integer)
    {
        float r = c.r / float (std::numeric_limits<T>::max ());
        float g = c.g / float (std::numeric_limits<T>::max ());
        float b = c.b / float (std::numeric_limits<T>::max ());
        float a = c.a / float (std::numeric_limits<T>::max ());
        return rgb2packed (C4f (r, g, b, a));
    }
    else
    {
        // clang-format off
	return (  (PackedColor) (c.r * 255)		|
		(((PackedColor) (c.g * 255)) << 8)	|
		(((PackedColor) (c.b * 255)) << 16)	|
		(((PackedColor) (c.a * 255)) << 24));
        // clang-format on
    }
}